

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
* __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::get_regex_operator
          (static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_regex<char,_std::__cxx11::regex_traits<char>_> *pattern)

{
  pointer *__ptr;
  _Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  local_28;
  _Head_base<0UL,_jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  local_20;
  
  std::
  make_unique<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>>
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_20);
  local_28._M_head_impl =
       &(local_20._M_head_impl)->
        super_unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ;
  local_20._M_head_impl =
       (regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)0x0;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
              *)&this->unary_operators_,
             (unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              *)&local_28);
  if (local_28._M_head_impl !=
      (unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       *)0x0) {
    (*(local_28._M_head_impl)->_vptr_unary_operator[1])();
  }
  local_28._M_head_impl =
       (unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)0x0;
  std::
  unique_ptr<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *)&local_20);
  return (this->unary_operators_).
         super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         .
         super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
         ._M_head_impl;
}

Assistant:

const unary_operator<Json>* get_regex_operator(std::basic_regex<char_type>&& pattern) 
        {
            unary_operators_.push_back(jsoncons::make_unique<regex_operator<Json>>(std::move(pattern)));
            return unary_operators_.back().get();
        }